

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_mdtm_resp(connectdata *conn,int ftpcode)

{
  int iVar1;
  curl_off_t *pcVar2;
  undefined4 *puVar3;
  undefined8 uVar4;
  undefined4 *puVar6;
  undefined8 uVar7;
  int local_164;
  tm *tm;
  tm buffer;
  time_t filetime;
  char headerbuf [128];
  time_t local_80;
  time_t secs;
  char timebuf [24];
  undefined4 local_58;
  undefined4 local_54;
  int second;
  int minute;
  int hour;
  int day;
  int month;
  int year;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  CURLcode result;
  int ftpcode_local;
  connectdata *conn_local;
  undefined4 uVar5;
  undefined4 uVar8;
  
  data._0_4_ = CURLE_OK;
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((Curl_easy *)ftp)->req).protop;
  _month = &conn->proto;
  data._4_4_ = ftpcode;
  _result = conn;
  if (ftpcode == 0xd5) {
    puVar3 = &local_54;
    puVar6 = &local_58;
    iVar1 = __isoc99_sscanf((((Curl_easy *)ftp)->state).buffer + 4,"%04d%02d%02d%02d%02d%02d",&day,
                            &hour,&minute,&second,puVar3,puVar6);
    uVar8 = (undefined4)((ulong)puVar6 >> 0x20);
    uVar5 = (undefined4)((ulong)puVar3 >> 0x20);
    if (iVar1 == 6) {
      local_80 = time((time_t *)0x0);
      uVar4 = CONCAT44(uVar5,second);
      uVar7 = CONCAT44(uVar8,local_54);
      curl_msnprintf((char *)&secs,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",(ulong)(uint)day,
                     (ulong)(uint)hour,(ulong)(uint)minute,uVar4,uVar7,local_58);
      uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
      uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
      pcVar2 = (curl_off_t *)curl_getdate((char *)&secs,&local_80);
      ftp[0x209].bytecountp = pcVar2;
    }
    if (((((ftp[0x30].downloadsize & 0x100) != 0) && ((_month->ftpc).file != (char *)0x0)) &&
        (((ulong)ftp[0x30].passwd & 0x10000) != 0)) && (-1 < (long)ftp[0x209].bytecountp)) {
      buffer.tm_zone = (char *)ftp[0x209].bytecountp;
      data._0_4_ = Curl_gmtime((time_t)buffer.tm_zone,(tm *)&tm);
      if ((CURLcode)data != CURLE_OK) {
        return (CURLcode)data;
      }
      if (buffer.tm_mon == 0) {
        local_164 = 6;
      }
      else {
        local_164 = buffer.tm_mon + -1;
      }
      curl_msnprintf((char *)&filetime,0x80,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                     Curl_wkday[local_164],(ulong)(uint)buffer.tm_min,Curl_month[buffer.tm_hour],
                     CONCAT44(uVar5,buffer.tm_mday + 0x76c),CONCAT44(uVar8,buffer.tm_sec),tm._4_4_,
                     tm._0_4_);
      data._0_4_ = Curl_client_write(_result,3,(char *)&filetime,0);
      if ((CURLcode)data != CURLE_OK) {
        return (CURLcode)data;
      }
    }
  }
  else if (ftpcode == 0x226) {
    Curl_failf((Curl_easy *)ftp,"Given file does not exist");
    data._0_4_ = CURLE_FTP_COULDNT_RETR_FILE;
  }
  else {
    Curl_infof((Curl_easy *)ftp,"unsupported MDTM reply format\n");
  }
  if ((int)ftp[0x24].downloadsize != 0) {
    if (((long)ftp[0x209].bytecountp < 1) || ((long)ftp[0x25].bytecountp < 1)) {
      Curl_infof((Curl_easy *)ftp,"Skipping time comparison\n");
    }
    else {
      iVar1 = (int)ftp[0x24].downloadsize;
      if ((iVar1 == 1) || (iVar1 != 2)) {
        if ((long)ftp[0x209].bytecountp <= (long)ftp[0x25].bytecountp) {
          Curl_infof((Curl_easy *)ftp,"The requested document is not new enough\n");
          *(undefined4 *)&(ftpc->pp).linestart_resp = 2;
          *(undefined1 *)&ftp[0x209].user = 1;
          _state(_result,FTP_STOP);
          return CURLE_OK;
        }
      }
      else if ((long)ftp[0x25].bytecountp < (long)ftp[0x209].bytecountp) {
        Curl_infof((Curl_easy *)ftp,"The requested document is not old enough\n");
        *(undefined4 *)&(ftpc->pp).linestart_resp = 2;
        *(undefined1 *)&ftp[0x209].user = 1;
        _state(_result,FTP_STOP);
        return CURLE_OK;
      }
    }
  }
  if ((CURLcode)data == CURLE_OK) {
    data._0_4_ = ftp_state_type(_result);
  }
  return (CURLcode)data;
}

Assistant:

static CURLcode ftp_state_mdtm_resp(struct connectdata *conn,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  switch(ftpcode) {
  case 213:
    {
      /* we got a time. Format should be: "YYYYMMDDHHMMSS[.sss]" where the
         last .sss part is optional and means fractions of a second */
      int year, month, day, hour, minute, second;
      if(6 == sscanf(&data->state.buffer[4], "%04d%02d%02d%02d%02d%02d",
                     &year, &month, &day, &hour, &minute, &second)) {
        /* we have a time, reformat it */
        char timebuf[24];
        time_t secs = time(NULL);

        snprintf(timebuf, sizeof(timebuf),
                 "%04d%02d%02d %02d:%02d:%02d GMT",
                 year, month, day, hour, minute, second);
        /* now, convert this into a time() value: */
        data->info.filetime = curl_getdate(timebuf, &secs);
      }

#ifdef CURL_FTP_HTTPSTYLE_HEAD
      /* If we asked for a time of the file and we actually got one as well,
         we "emulate" a HTTP-style header in our output. */

      if(data->set.opt_no_body &&
         ftpc->file &&
         data->set.get_filetime &&
         (data->info.filetime >= 0) ) {
        char headerbuf[128];
        time_t filetime = data->info.filetime;
        struct tm buffer;
        const struct tm *tm = &buffer;

        result = Curl_gmtime(filetime, &buffer);
        if(result)
          return result;

        /* format: "Tue, 15 Nov 1994 12:45:26" */
        snprintf(headerbuf, sizeof(headerbuf),
                 "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                 Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
                 tm->tm_mday,
                 Curl_month[tm->tm_mon],
                 tm->tm_year + 1900,
                 tm->tm_hour,
                 tm->tm_min,
                 tm->tm_sec);
        result = Curl_client_write(conn, CLIENTWRITE_BOTH, headerbuf, 0);
        if(result)
          return result;
      } /* end of a ridiculous amount of conditionals */
#endif
    }
    break;
  default:
    infof(data, "unsupported MDTM reply format\n");
    break;
  case 550: /* "No such file or directory" */
    failf(data, "Given file does not exist");
    result = CURLE_FTP_COULDNT_RETR_FILE;
    break;
  }

  if(data->set.timecondition) {
    if((data->info.filetime > 0) && (data->set.timevalue > 0)) {
      switch(data->set.timecondition) {
      case CURL_TIMECOND_IFMODSINCE:
      default:
        if(data->info.filetime <= data->set.timevalue) {
          infof(data, "The requested document is not new enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      case CURL_TIMECOND_IFUNMODSINCE:
        if(data->info.filetime > data->set.timevalue) {
          infof(data, "The requested document is not old enough\n");
          ftp->transfer = FTPTRANSFER_NONE; /* mark to not transfer data */
          data->info.timecond = TRUE;
          state(conn, FTP_STOP);
          return CURLE_OK;
        }
        break;
      } /* switch */
    }
    else {
      infof(data, "Skipping time comparison\n");
    }
  }

  if(!result)
    result = ftp_state_type(conn);

  return result;
}